

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTiming.c
# Opt level: O3

void Aig_ManUpdateLevel(Aig_Man_t *p,Aig_Obj_t *pObjNew)

{
  ulong uVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  uint uVar4;
  Vec_Vec_t *pVVar5;
  void **ppvVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  void *pvVar12;
  uint uVar13;
  ulong uVar14;
  
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                  ,199,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
  }
  if ((*(uint *)&pObjNew->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObjNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                  ,200,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
  }
  pVVar5 = p->vLevels;
  if (pVVar5 == (Vec_Vec_t *)0x0) {
    uVar3 = Aig_ManLevels(p);
    pVVar5 = (Vec_Vec_t *)malloc(0x10);
    iVar10 = 8;
    if (uVar3 < 0xfffffff9) {
      iVar10 = uVar3 + 8;
    }
    pVVar5->nSize = 0;
    pVVar5->nCap = iVar10;
    if (iVar10 == 0) {
      ppvVar6 = (void **)0x0;
    }
    else {
      ppvVar6 = (void **)malloc((long)iVar10 << 3);
    }
    pVVar5->pArray = ppvVar6;
    p->vLevels = pVVar5;
  }
  if (((ulong)pObjNew & 1) == 0) {
    uVar4 = (uint)((ulong)*(undefined8 *)&pObjNew->field_0x18 >> 0x20);
    uVar3 = uVar4 & 0xffffff;
    uVar7 = (ulong)pObjNew->pFanin1 & 0xfffffffffffffffe;
    if (uVar7 == 0) {
      uVar13 = *(uint *)(((ulong)pObjNew->pFanin0 & 0xfffffffffffffffe) + 0x1c) & 0xffffff;
    }
    else {
      uVar9 = *(uint *)(((ulong)pObjNew->pFanin0 & 0xfffffffffffffffe) + 0x1c) & 0xffffff;
      uVar13 = *(uint *)(uVar7 + 0x1c) & 0xffffff;
      if (uVar13 < uVar9) {
        uVar13 = uVar9;
      }
      uVar13 = (((uint)*(undefined8 *)&pObjNew->field_0x18 & 7) == 6) + uVar13 + 1;
    }
    if (uVar3 != uVar13) {
      iVar10 = pVVar5->nSize;
      if (0 < (long)iVar10) {
        ppvVar6 = pVVar5->pArray;
        lVar11 = 0;
        do {
          *(undefined4 *)((long)ppvVar6[lVar11] + 4) = 0;
          lVar11 = lVar11 + 1;
        } while (iVar10 != lVar11);
      }
      Vec_VecPush(pVVar5,uVar3,pObjNew);
      pObjNew->field_0x18 = pObjNew->field_0x18 | 0x10;
      pVVar5 = p->vLevels;
      uVar7 = (ulong)(uint)pVVar5->nSize;
      if ((int)uVar3 < pVVar5->nSize) {
        uVar14 = (ulong)(uVar4 & 0xffffff);
        uVar3 = 0xffffffff;
        do {
          if ((long)(int)uVar7 <= (long)uVar14) {
LAB_006d459f:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                          ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
          }
          pvVar12 = pVVar5->pArray[uVar14];
          if (0 < *(int *)((long)pvVar12 + 4)) {
            lVar11 = 0;
            do {
              uVar7 = *(ulong *)(*(long *)((long)pvVar12 + 8) + lVar11 * 8);
              uVar1 = *(ulong *)(uVar7 + 0x18);
              *(ulong *)(uVar7 + 0x18) = uVar1 & 0xffffffffffffffef;
              if ((uVar7 & 1) != 0) goto LAB_006d4542;
              if (((uint)(uVar1 >> 0x20) & 0xffffff) != uVar14) {
                __assert_fail("Aig_ObjLevel(pTemp) == Lev",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                              ,0xda,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
              }
              uVar8 = *(ulong *)(uVar7 + 0x10) & 0xfffffffffffffffe;
              if (uVar8 == 0) {
                uVar4 = *(uint *)((*(ulong *)(uVar7 + 8) & 0xfffffffffffffffe) + 0x1c);
              }
              else {
                uVar13 = *(uint *)((*(ulong *)(uVar7 + 8) & 0xfffffffffffffffe) + 0x1c) & 0xffffff;
                uVar4 = *(uint *)(uVar8 + 0x1c) & 0xffffff;
                if (uVar4 < uVar13) {
                  uVar4 = uVar13;
                }
                uVar4 = (((uint)uVar1 & 7) == 6) + uVar4 + 1;
              }
              uVar8 = uVar1 & 0xff000000ffffffef | (ulong)(uVar4 & 0xffffff) << 0x20;
              *(ulong *)(uVar7 + 0x18) = uVar8;
              if (uVar14 != (uVar4 & 0xffffff)) {
                if (p->pFanData == (int *)0x0) {
                  __assert_fail("p->pFanData",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                                ,0xe0,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
                }
                if ((uVar1 & 0xffffffc0) != 0) {
                  uVar4 = 0;
                  do {
                    if (uVar4 == 0) {
                      if (p->nFansAlloc <= *(int *)(uVar7 + 0x24)) {
                        __assert_fail("ObjId < p->nFansAlloc",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                                      ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
                      }
                      iVar10 = *(int *)(uVar7 + 0x24) * 5;
                    }
                    else {
                      if (p->nFansAlloc <= (int)uVar3 / 2) {
                        __assert_fail("iFan/2 < p->nFansAlloc",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                                      ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
                      }
                      iVar10 = ((int)uVar3 >> 1) * 5 + (uVar3 & 1) + 3;
                    }
                    pVVar2 = p->vObjs;
                    uVar3 = p->pFanData[iVar10];
                    if (pVVar2 == (Vec_Ptr_t *)0x0) {
                      pvVar12 = (void *)0x0;
                    }
                    else {
                      uVar13 = (int)uVar3 >> 1;
                      if (((int)uVar13 < 0) || (pVVar2->nSize <= (int)uVar13)) {
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                      }
                      pvVar12 = pVVar2->pArray[uVar13];
                    }
                    uVar1 = *(ulong *)((long)pvVar12 + 0x18);
                    if (((uVar1 & 0x10) == 0) && (((uint)uVar1 & 7) - 5 < 2)) {
                      if (((ulong)pvVar12 & 1) != 0) goto LAB_006d4542;
                      uVar13 = (uint)(uVar1 >> 0x20);
                      if ((uVar13 & 0xffffff) < uVar14) {
                        __assert_fail("Aig_ObjLevel(pFanout) >= Lev",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                                      ,0xe4,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
                      }
                      Vec_VecPush(p->vLevels,uVar13 & 0xffffff,pvVar12);
                      *(byte *)((long)pvVar12 + 0x18) = *(byte *)((long)pvVar12 + 0x18) | 0x10;
                      uVar8 = *(ulong *)(uVar7 + 0x18);
                    }
                    uVar4 = uVar4 + 1;
                  } while (uVar4 < ((uint)(uVar8 >> 6) & 0x3ffffff));
                }
              }
              pVVar5 = p->vLevels;
              uVar7 = (ulong)pVVar5->nSize;
              if ((long)uVar7 <= (long)uVar14) goto LAB_006d459f;
              lVar11 = lVar11 + 1;
              pvVar12 = pVVar5->pArray[uVar14];
            } while (lVar11 < *(int *)((long)pvVar12 + 4));
          }
          uVar14 = uVar14 + 1;
        } while ((long)uVar14 < (long)(int)uVar7);
      }
    }
    return;
  }
LAB_006d4542:
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                ,0x143,"int Aig_ObjLevel(Aig_Obj_t *)");
}

Assistant:

void Aig_ManUpdateLevel( Aig_Man_t * p, Aig_Obj_t * pObjNew )
{
    Aig_Obj_t * pFanout, * pTemp;
    int iFanout = -1, LevelOld, Lev, k, m;
    assert( p->pFanData != NULL );
    assert( Aig_ObjIsNode(pObjNew) );
    // allocate level if needed
    if ( p->vLevels == NULL )
        p->vLevels = Vec_VecAlloc( Aig_ManLevels(p) + 8 );
    // check if level has changed
    LevelOld = Aig_ObjLevel(pObjNew);
    if ( LevelOld == Aig_ObjLevelNew(pObjNew) )
        return;
    // start the data structure for level update
    // we cannot fail to visit a node when using this structure because the 
    // nodes are stored by their _old_ levels, which are assumed to be correct
    Vec_VecClear( p->vLevels );
    Vec_VecPush( p->vLevels, LevelOld, pObjNew );
    pObjNew->fMarkA = 1;
    // recursively update level
    Vec_VecForEachEntryStart( Aig_Obj_t *, p->vLevels, pTemp, Lev, k, LevelOld )
    {
        pTemp->fMarkA = 0;
        assert( Aig_ObjLevel(pTemp) == Lev );
        pTemp->Level = Aig_ObjLevelNew(pTemp);
        // if the level did not change, no need to check the fanout levels
        if ( Aig_ObjLevel(pTemp) == Lev )
            continue;
        // schedule fanout for level update
        Aig_ObjForEachFanout( p, pTemp, pFanout, iFanout, m )
        {
            if ( Aig_ObjIsNode(pFanout) && !pFanout->fMarkA )
            {
                assert( Aig_ObjLevel(pFanout) >= Lev );
                Vec_VecPush( p->vLevels, Aig_ObjLevel(pFanout), pFanout );
                pFanout->fMarkA = 1;
            }
        }
    }
}